

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configfile.cpp
# Opt level: O0

bool __thiscall FConfigFile::WriteConfigFile(FConfigFile *this)

{
  bool bVar1;
  char *pcVar2;
  FILE *__stream;
  char *endtag;
  FConfigEntry *entry;
  FConfigSection *section;
  FILE *file;
  FConfigFile *this_local;
  
  if (((this->OkayToWrite & 1U) == 0) && ((this->FileExisted & 1U) != 0)) {
    this_local._7_1_ = true;
  }
  else {
    pcVar2 = FString::operator_cast_to_char_(&this->PathName);
    __stream = fopen(pcVar2,"w");
    if (__stream == (FILE *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      (*this->_vptr_FConfigFile[2])(this,__stream);
      entry = (FConfigEntry *)this->Sections;
      while (entry != (FConfigEntry *)0x0) {
        endtag = (char *)entry->Next;
        bVar1 = FString::IsNotEmpty((FString *)&entry[1].Next);
        if (bVar1) {
          pcVar2 = FString::GetChars((FString *)&entry[1].Next);
          fputs(pcVar2,__stream);
        }
        pcVar2 = FString::GetChars((FString *)entry);
        fprintf(__stream,"[%s]\n",pcVar2);
        for (; endtag != (char *)0x0; endtag = *(char **)(endtag + 8)) {
          pcVar2 = strpbrk(*(char **)endtag,"\r\n");
          if (pcVar2 == (char *)0x0) {
            fprintf(__stream,"%s=%s\n",endtag + 0x10,*(undefined8 *)endtag);
          }
          else {
            pcVar2 = GenerateEndTag(*(char **)endtag);
            fprintf(__stream,"%s=<<<%s\n%s\n>>>%s\n",endtag + 0x10,pcVar2,*(undefined8 *)endtag,
                    pcVar2);
          }
        }
        entry = (FConfigEntry *)entry[1].Value;
        fputs("\n",__stream);
      }
      fclose(__stream);
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool FConfigFile::WriteConfigFile () const
{
	if (!OkayToWrite && FileExisted)
	{ // Pretend it was written anyway so that the user doesn't get
	  // any "config not written" notifications, but only if the file
	  // already existed. Otherwise, let it write out a default one.
		return true;
	}

	FILE *file = fopen (PathName, "w");
	FConfigSection *section;
	FConfigEntry *entry;

	if (file == NULL)
		return false;

	WriteCommentHeader (file);

	section = Sections;
	while (section != NULL)
	{
		entry = section->RootEntry;
		if (section->Note.IsNotEmpty())
		{
			fputs (section->Note.GetChars(), file);
		}
		fprintf (file, "[%s]\n", section->SectionName.GetChars());
		while (entry != NULL)
		{
			if (strpbrk(entry->Value, "\r\n") == NULL)
			{ // Single-line value
				fprintf (file, "%s=%s\n", entry->Key, entry->Value);
			}
			else
			{ // Multi-line value
				const char *endtag = GenerateEndTag(entry->Value);
				fprintf (file, "%s=<<<%s\n%s\n>>>%s\n", entry->Key,
					endtag, entry->Value, endtag);
			}
			entry = entry->Next;
		}
		section = section->Next;
		fputs ("\n", file);
	}
	fclose (file);
	return true;
}